

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::op_queue<asio::detail::wait_op>::push<asio::detail::wait_op>
          (op_queue<asio::detail::wait_op> *this,op_queue<asio::detail::wait_op> *q)

{
  wait_op *o2;
  wait_op **ppwVar1;
  wait_op *other_front;
  op_queue<asio::detail::wait_op> *q_local;
  op_queue<asio::detail::wait_op> *this_local;
  
  ppwVar1 = op_queue_access::front<asio::detail::wait_op>(q);
  o2 = *ppwVar1;
  if (o2 != (wait_op *)0x0) {
    if (this->back_ == (wait_op *)0x0) {
      this->front_ = o2;
    }
    else {
      op_queue_access::next<asio::detail::wait_op,asio::detail::wait_op>(&this->back_,o2);
    }
    ppwVar1 = op_queue_access::back<asio::detail::wait_op>(q);
    this->back_ = *ppwVar1;
    ppwVar1 = op_queue_access::front<asio::detail::wait_op>(q);
    *ppwVar1 = (wait_op *)0x0;
    ppwVar1 = op_queue_access::back<asio::detail::wait_op>(q);
    *ppwVar1 = (wait_op *)0x0;
  }
  return;
}

Assistant:

void push(op_queue<OtherOperation>& q)
  {
    if (Operation* other_front = op_queue_access::front(q))
    {
      if (back_)
        op_queue_access::next(back_, other_front);
      else
        front_ = other_front;
      back_ = op_queue_access::back(q);
      op_queue_access::front(q) = 0;
      op_queue_access::back(q) = 0;
    }
  }